

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersector1<4,_1,_true,_embree::avx::ArrayIntersector1<embree::avx::TriangleMiIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  undefined8 *puVar1;
  float fVar2;
  undefined4 uVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  float **ppfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  Geometry *pGVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong *puVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  float fVar32;
  undefined1 auVar26 [16];
  float fVar33;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar34;
  float fVar45;
  float fVar46;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar47;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar48;
  float fVar56;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar57;
  float fVar58;
  undefined1 auVar55 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar70;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [64];
  float fVar71;
  float fVar72;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  undefined1 auVar73 [16];
  float fVar81;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  float fVar82;
  undefined1 auVar76 [64];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [64];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [64];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [64];
  float fVar100;
  undefined1 auVar101 [16];
  float fVar108;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  float fVar106;
  float fVar107;
  undefined1 auVar105 [64];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [64];
  float fVar113;
  float fVar115;
  float fVar116;
  float fVar117;
  undefined1 auVar114 [64];
  float fVar118;
  float fVar120;
  float fVar121;
  float fVar122;
  undefined1 auVar119 [64];
  float fVar123;
  float fVar125;
  float fVar126;
  float fVar127;
  undefined1 auVar124 [64];
  float fVar128;
  undefined1 auVar129 [16];
  float fVar131;
  float fVar132;
  float fVar133;
  undefined1 auVar130 [64];
  float fVar134;
  float fVar135;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  undefined1 auVar136 [16];
  float fVar142;
  undefined1 auVar137 [16];
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  UVIdentity<4> mapUV;
  Scene *scene;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  undefined1 local_abd;
  int local_abc;
  undefined8 local_ab8;
  float fStack_ab0;
  float fStack_aac;
  undefined8 local_aa8;
  float fStack_aa0;
  float fStack_a9c;
  undefined8 local_a98;
  float fStack_a90;
  float fStack_a8c;
  Scene *local_a80;
  undefined1 local_a78 [16];
  undefined1 local_a68 [16];
  undefined1 local_a58 [16];
  undefined1 local_a48 [16];
  undefined1 local_a38 [16];
  undefined1 local_a28 [16];
  long local_a18;
  long local_a10;
  undefined4 local_a08;
  undefined4 local_a04;
  undefined4 local_a00;
  undefined4 local_9fc;
  undefined4 local_9f8;
  undefined4 local_9f4;
  uint local_9f0;
  uint local_9ec;
  uint local_9e8;
  RTCFilterFunctionNArguments local_9d8;
  undefined1 local_9a8 [16];
  undefined1 local_998 [16];
  undefined1 local_988 [16];
  undefined1 local_978 [16];
  undefined1 local_968 [16];
  undefined1 local_958 [16];
  undefined1 local_948 [16];
  undefined1 local_938 [16];
  undefined1 local_928 [16];
  undefined1 local_918 [16];
  undefined1 local_908 [16];
  undefined1 local_8f8 [16];
  undefined1 local_8e8 [16];
  undefined1 local_8d8 [16];
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined1 local_888 [16];
  undefined1 local_878 [16];
  undefined1 local_868 [16];
  undefined1 *local_858;
  undefined1 local_848 [16];
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  undefined1 local_808 [16];
  undefined1 local_7f8 [16];
  undefined1 local_7e8 [16];
  ulong local_7d8;
  ulong local_7d0 [244];
  
  local_7d8 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_7d8 != 8) {
    fVar2 = ray->tfar;
    if (0.0 <= fVar2) {
      puVar21 = local_7d0;
      auVar26 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      aVar4 = (ray->dir).field_0;
      auVar68._8_4_ = 0x7fffffff;
      auVar68._0_8_ = 0x7fffffff7fffffff;
      auVar68._12_4_ = 0x7fffffff;
      auVar68 = vandps_avx((undefined1  [16])aVar4,auVar68);
      auVar83._8_4_ = 0x219392ef;
      auVar83._0_8_ = 0x219392ef219392ef;
      auVar83._12_4_ = 0x219392ef;
      auVar68 = vcmpps_avx(auVar68,auVar83,1);
      auVar84._8_4_ = 0x3f800000;
      auVar84._0_8_ = 0x3f8000003f800000;
      auVar84._12_4_ = 0x3f800000;
      auVar83 = vdivps_avx(auVar84,(undefined1  [16])aVar4);
      auVar85._8_4_ = 0x5d5e0b6b;
      auVar85._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar85._12_4_ = 0x5d5e0b6b;
      auVar68 = vblendvps_avx(auVar83,auVar85,auVar68);
      auVar73._0_4_ = auVar68._0_4_ * 0.99999964;
      auVar73._4_4_ = auVar68._4_4_ * 0.99999964;
      auVar73._8_4_ = auVar68._8_4_ * 0.99999964;
      auVar73._12_4_ = auVar68._12_4_ * 0.99999964;
      auVar59._0_4_ = auVar68._0_4_ * 1.0000004;
      auVar59._4_4_ = auVar68._4_4_ * 1.0000004;
      auVar59._8_4_ = auVar68._8_4_ * 1.0000004;
      auVar59._12_4_ = auVar68._12_4_ * 1.0000004;
      uVar3 = *(undefined4 *)&(ray->org).field_0;
      auVar99 = ZEXT1664(CONCAT412(uVar3,CONCAT48(uVar3,CONCAT44(uVar3,uVar3))));
      uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      auVar105 = ZEXT1664(CONCAT412(uVar3,CONCAT48(uVar3,CONCAT44(uVar3,uVar3))));
      uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      auVar112 = ZEXT1664(CONCAT412(uVar3,CONCAT48(uVar3,CONCAT44(uVar3,uVar3))));
      auVar68 = vshufps_avx(auVar73,auVar73,0);
      auVar114 = ZEXT1664(auVar68);
      auVar68 = vmovshdup_avx(auVar73);
      auVar83 = vshufps_avx(auVar73,auVar73,0x55);
      auVar119 = ZEXT1664(auVar83);
      auVar83 = vshufpd_avx(auVar73,auVar73,1);
      auVar84 = vshufps_avx(auVar73,auVar73,0xaa);
      auVar76 = ZEXT1664(auVar84);
      auVar84 = vshufps_avx(auVar59,auVar59,0);
      auVar124 = ZEXT1664(auVar84);
      uVar22 = (ulong)(auVar73._0_4_ < 0.0) << 4;
      auVar84 = vshufps_avx(auVar59,auVar59,0x55);
      auVar89 = ZEXT1664(auVar84);
      auVar84 = vshufps_avx(auVar59,auVar59,0xaa);
      auVar69 = ZEXT1664(auVar84);
      uVar20 = (ulong)(auVar68._0_4_ < 0.0) << 4 | 0x20;
      uVar23 = (ulong)(auVar83._0_4_ < 0.0) << 4 | 0x40;
      uVar24 = uVar22 ^ 0x10;
      auVar68 = vshufps_avx(auVar26,auVar26,0);
      auVar93 = ZEXT1664(auVar68);
      auVar68 = vshufps_avx(ZEXT416((uint)fVar2),ZEXT416((uint)fVar2),0);
      auVar130 = ZEXT1664(auVar68);
      local_9a8 = mm_lookupmask_ps._240_16_;
      do {
        uVar25 = puVar21[-1];
        puVar21 = puVar21 + -1;
        local_8f8 = auVar99._0_16_;
        local_908 = auVar105._0_16_;
        local_918 = auVar112._0_16_;
        while ((uVar25 & 8) == 0) {
          auVar68 = vsubps_avx(*(undefined1 (*) [16])(uVar25 + 0x20 + uVar22),local_8f8);
          auVar26._0_4_ = auVar114._0_4_ * auVar68._0_4_;
          auVar26._4_4_ = auVar114._4_4_ * auVar68._4_4_;
          auVar26._8_4_ = auVar114._8_4_ * auVar68._8_4_;
          auVar26._12_4_ = auVar114._12_4_ * auVar68._12_4_;
          auVar68 = vsubps_avx(*(undefined1 (*) [16])(uVar25 + 0x20 + uVar20),local_908);
          auVar35._0_4_ = auVar119._0_4_ * auVar68._0_4_;
          auVar35._4_4_ = auVar119._4_4_ * auVar68._4_4_;
          auVar35._8_4_ = auVar119._8_4_ * auVar68._8_4_;
          auVar35._12_4_ = auVar119._12_4_ * auVar68._12_4_;
          auVar68 = vmaxps_avx(auVar26,auVar35);
          auVar83 = vsubps_avx(*(undefined1 (*) [16])(uVar25 + 0x20 + uVar23),local_918);
          auVar36._0_4_ = auVar76._0_4_ * auVar83._0_4_;
          auVar36._4_4_ = auVar76._4_4_ * auVar83._4_4_;
          auVar36._8_4_ = auVar76._8_4_ * auVar83._8_4_;
          auVar36._12_4_ = auVar76._12_4_ * auVar83._12_4_;
          auVar83 = vmaxps_avx(auVar36,auVar93._0_16_);
          auVar68 = vmaxps_avx(auVar68,auVar83);
          auVar83 = vsubps_avx(*(undefined1 (*) [16])(uVar25 + 0x20 + uVar24),local_8f8);
          auVar37._0_4_ = auVar124._0_4_ * auVar83._0_4_;
          auVar37._4_4_ = auVar124._4_4_ * auVar83._4_4_;
          auVar37._8_4_ = auVar124._8_4_ * auVar83._8_4_;
          auVar37._12_4_ = auVar124._12_4_ * auVar83._12_4_;
          auVar83 = vsubps_avx(*(undefined1 (*) [16])(uVar25 + 0x20 + (uVar20 ^ 0x10)),local_908);
          auVar49._0_4_ = auVar89._0_4_ * auVar83._0_4_;
          auVar49._4_4_ = auVar89._4_4_ * auVar83._4_4_;
          auVar49._8_4_ = auVar89._8_4_ * auVar83._8_4_;
          auVar49._12_4_ = auVar89._12_4_ * auVar83._12_4_;
          auVar83 = vminps_avx(auVar37,auVar49);
          auVar26 = vsubps_avx(*(undefined1 (*) [16])(uVar25 + 0x20 + (uVar23 ^ 0x10)),local_918);
          auVar50._0_4_ = auVar69._0_4_ * auVar26._0_4_;
          auVar50._4_4_ = auVar69._4_4_ * auVar26._4_4_;
          auVar50._8_4_ = auVar69._8_4_ * auVar26._8_4_;
          auVar50._12_4_ = auVar69._12_4_ * auVar26._12_4_;
          auVar26 = vminps_avx(auVar50,auVar130._0_16_);
          auVar83 = vminps_avx(auVar83,auVar26);
          auVar68 = vcmpps_avx(auVar68,auVar83,2);
          uVar18 = vmovmskps_avx(auVar68);
          if (uVar18 == 0) goto LAB_002c0234;
          uVar16 = uVar25 & 0xfffffffffffffff0;
          lVar17 = 0;
          if ((byte)uVar18 != 0) {
            for (; ((byte)uVar18 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
            }
          }
          uVar25 = *(ulong *)(uVar16 + lVar17 * 8);
          uVar18 = (uVar18 & 0xff) - 1 & uVar18 & 0xff;
          if (uVar18 != 0) {
            *puVar21 = uVar25;
            puVar21 = puVar21 + 1;
            lVar17 = 0;
            if (uVar18 != 0) {
              for (; (uVar18 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
              }
            }
            uVar25 = *(ulong *)(uVar16 + lVar17 * 8);
            uVar18 = uVar18 - 1 & uVar18;
            uVar19 = (ulong)uVar18;
            if (uVar18 != 0) {
              do {
                *puVar21 = uVar25;
                puVar21 = puVar21 + 1;
                lVar17 = 0;
                if (uVar19 != 0) {
                  for (; (uVar19 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
                  }
                }
                uVar25 = *(ulong *)(uVar16 + lVar17 * 8);
                uVar19 = uVar19 & uVar19 - 1;
              } while (uVar19 != 0);
            }
          }
        }
        local_a18 = (ulong)((uint)uVar25 & 0xf) - 8;
        if (local_a18 != 0) {
          uVar25 = uVar25 & 0xfffffffffffffff0;
          local_a10 = 0;
          local_928 = auVar114._0_16_;
          local_938 = auVar119._0_16_;
          local_948 = auVar76._0_16_;
          local_958 = auVar124._0_16_;
          local_968 = auVar89._0_16_;
          local_978 = auVar69._0_16_;
          local_988 = auVar93._0_16_;
          local_998 = auVar130._0_16_;
          local_a80 = context->scene;
          do {
            lVar17 = local_a10 * 0x50;
            ppfVar5 = (local_a80->vertices).items;
            pfVar6 = ppfVar5[*(uint *)(uVar25 + 0x30 + lVar17)];
            pfVar7 = ppfVar5[*(uint *)(uVar25 + 0x34 + lVar17)];
            pfVar8 = ppfVar5[*(uint *)(uVar25 + 0x38 + lVar17)];
            pfVar9 = ppfVar5[*(uint *)(uVar25 + 0x3c + lVar17)];
            auVar26 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar25 + lVar17)),
                                    *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar25 + 8 + lVar17)))
            ;
            auVar68 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar25 + lVar17)),
                                    *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar25 + 8 + lVar17)))
            ;
            auVar84 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar25 + 4 + lVar17)),
                                    *(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar25 + 0xc + lVar17)));
            auVar83 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar25 + 4 + lVar17)),
                                    *(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar25 + 0xc + lVar17)));
            auVar73 = vunpcklps_avx(auVar68,auVar83);
            auVar85 = vunpcklps_avx(auVar26,auVar84);
            auVar68 = vunpckhps_avx(auVar26,auVar84);
            auVar84 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar25 + 0x10 + lVar17)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar25 + 0x18 + lVar17)));
            auVar83 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar25 + 0x10 + lVar17)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar25 + 0x18 + lVar17)));
            auVar59 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar25 + 0x14 + lVar17)),
                                    *(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar25 + 0x1c + lVar17)));
            auVar26 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar25 + 0x14 + lVar17)),
                                    *(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar25 + 0x1c + lVar17)));
            auVar35 = vunpcklps_avx(auVar83,auVar26);
            auVar36 = vunpcklps_avx(auVar84,auVar59);
            auVar83 = vunpckhps_avx(auVar84,auVar59);
            auVar59 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar25 + 0x20 + lVar17)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar25 + 0x28 + lVar17)));
            auVar26 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar25 + 0x20 + lVar17)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar25 + 0x28 + lVar17)));
            auVar37 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar25 + 0x24 + lVar17)),
                                    *(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar25 + 0x2c + lVar17)));
            auVar84 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar25 + 0x24 + lVar17)),
                                    *(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar25 + 0x2c + lVar17)));
            auVar49 = vunpcklps_avx(auVar26,auVar84);
            auVar84 = vunpcklps_avx(auVar59,auVar37);
            auVar59 = vunpckhps_avx(auVar59,auVar37);
            puVar1 = (undefined8 *)(uVar25 + 0x30 + lVar17);
            local_898 = *puVar1;
            uStack_890 = puVar1[1];
            puVar1 = (undefined8 *)(uVar25 + 0x40 + lVar17);
            local_8a8 = *puVar1;
            uStack_8a0 = puVar1[1];
            uVar3 = *(undefined4 *)&(ray->org).field_0;
            auVar109._4_4_ = uVar3;
            auVar109._0_4_ = uVar3;
            auVar109._8_4_ = uVar3;
            auVar109._12_4_ = uVar3;
            uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
            auVar129._4_4_ = uVar3;
            auVar129._0_4_ = uVar3;
            auVar129._8_4_ = uVar3;
            auVar129._12_4_ = uVar3;
            uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
            auVar136._4_4_ = uVar3;
            auVar136._0_4_ = uVar3;
            auVar136._8_4_ = uVar3;
            auVar136._12_4_ = uVar3;
            local_a28 = vsubps_avx(auVar85,auVar109);
            local_a38 = vsubps_avx(auVar68,auVar129);
            local_a48 = vsubps_avx(auVar73,auVar136);
            auVar68 = vsubps_avx(auVar36,auVar109);
            auVar83 = vsubps_avx(auVar83,auVar129);
            auVar26 = vsubps_avx(auVar35,auVar136);
            auVar84 = vsubps_avx(auVar84,auVar109);
            auVar59 = vsubps_avx(auVar59,auVar129);
            auVar73 = vsubps_avx(auVar49,auVar136);
            local_a58 = vsubps_avx(auVar84,local_a28);
            local_a68 = vsubps_avx(auVar59,local_a38);
            local_a78 = vsubps_avx(auVar73,local_a48);
            fVar2 = local_a38._0_4_;
            fVar34 = auVar59._0_4_ + fVar2;
            fVar12 = local_a38._4_4_;
            fVar45 = auVar59._4_4_ + fVar12;
            fVar57 = local_a38._8_4_;
            fVar46 = auVar59._8_4_ + fVar57;
            fVar14 = local_a38._12_4_;
            fVar47 = auVar59._12_4_ + fVar14;
            fVar113 = local_a48._0_4_;
            fVar71 = fVar113 + auVar73._0_4_;
            fVar115 = local_a48._4_4_;
            fVar77 = fVar115 + auVar73._4_4_;
            fVar116 = local_a48._8_4_;
            fVar79 = fVar116 + auVar73._8_4_;
            fVar117 = local_a48._12_4_;
            fVar81 = fVar117 + auVar73._12_4_;
            fVar48 = local_a78._0_4_;
            auVar101._0_4_ = fVar48 * fVar34;
            fVar56 = local_a78._4_4_;
            auVar101._4_4_ = fVar56 * fVar45;
            fVar32 = local_a78._8_4_;
            auVar101._8_4_ = fVar32 * fVar46;
            fVar33 = local_a78._12_4_;
            auVar101._12_4_ = fVar33 * fVar47;
            fVar144 = local_a68._0_4_;
            auVar110._0_4_ = fVar144 * fVar71;
            fVar145 = local_a68._4_4_;
            auVar110._4_4_ = fVar145 * fVar77;
            fVar146 = local_a68._8_4_;
            auVar110._8_4_ = fVar146 * fVar79;
            fVar147 = local_a68._12_4_;
            auVar110._12_4_ = fVar147 * fVar81;
            auVar85 = vsubps_avx(auVar110,auVar101);
            fVar11 = local_a28._0_4_;
            fVar100 = auVar84._0_4_ + fVar11;
            fVar13 = local_a28._4_4_;
            fVar106 = auVar84._4_4_ + fVar13;
            fVar58 = local_a28._8_4_;
            fVar107 = auVar84._8_4_ + fVar58;
            fVar15 = local_a28._12_4_;
            fVar108 = auVar84._12_4_ + fVar15;
            fVar134 = local_a58._0_4_;
            auVar74._0_4_ = fVar134 * fVar71;
            fVar138 = local_a58._4_4_;
            auVar74._4_4_ = fVar138 * fVar77;
            fVar140 = local_a58._8_4_;
            auVar74._8_4_ = fVar140 * fVar79;
            fVar142 = local_a58._12_4_;
            auVar74._12_4_ = fVar142 * fVar81;
            auVar111._0_4_ = fVar100 * fVar48;
            auVar111._4_4_ = fVar106 * fVar56;
            auVar111._8_4_ = fVar107 * fVar32;
            auVar111._12_4_ = fVar108 * fVar33;
            auVar35 = vsubps_avx(auVar111,auVar74);
            auVar102._0_4_ = fVar144 * fVar100;
            auVar102._4_4_ = fVar145 * fVar106;
            auVar102._8_4_ = fVar146 * fVar107;
            auVar102._12_4_ = fVar147 * fVar108;
            auVar27._0_4_ = fVar134 * fVar34;
            auVar27._4_4_ = fVar138 * fVar45;
            auVar27._8_4_ = fVar140 * fVar46;
            auVar27._12_4_ = fVar142 * fVar47;
            auVar36 = vsubps_avx(auVar27,auVar102);
            local_aa8._4_4_ = (ray->dir).field_0.m128[2];
            local_ab8._4_4_ = (ray->dir).field_0.m128[1];
            fStack_a90 = (ray->dir).field_0.m128[0];
            local_a98 = (RTCIntersectArguments *)CONCAT44(fStack_a90,fStack_a90);
            fStack_a8c = fStack_a90;
            local_8c8._0_4_ =
                 auVar85._0_4_ * fStack_a90 +
                 local_ab8._4_4_ * auVar35._0_4_ + local_aa8._4_4_ * auVar36._0_4_;
            local_8c8._4_4_ =
                 auVar85._4_4_ * fStack_a90 +
                 local_ab8._4_4_ * auVar35._4_4_ + local_aa8._4_4_ * auVar36._4_4_;
            local_8c8._8_4_ =
                 auVar85._8_4_ * fStack_a90 +
                 local_ab8._4_4_ * auVar35._8_4_ + local_aa8._4_4_ * auVar36._8_4_;
            local_8c8._12_4_ =
                 auVar85._12_4_ * fStack_a90 +
                 local_ab8._4_4_ * auVar35._12_4_ + local_aa8._4_4_ * auVar36._12_4_;
            local_8b8 = vsubps_avx(local_a38,auVar83);
            auVar85 = vsubps_avx(local_a48,auVar26);
            fVar34 = fVar2 + auVar83._0_4_;
            fVar45 = fVar12 + auVar83._4_4_;
            fVar46 = fVar57 + auVar83._8_4_;
            fVar47 = fVar14 + auVar83._12_4_;
            fVar71 = fVar113 + auVar26._0_4_;
            fVar77 = fVar115 + auVar26._4_4_;
            fVar79 = fVar116 + auVar26._8_4_;
            fVar81 = fVar117 + auVar26._12_4_;
            fVar118 = auVar85._0_4_;
            auVar137._0_4_ = fVar118 * fVar34;
            fVar120 = auVar85._4_4_;
            auVar137._4_4_ = fVar120 * fVar45;
            fVar121 = auVar85._8_4_;
            auVar137._8_4_ = fVar121 * fVar46;
            fVar122 = auVar85._12_4_;
            auVar137._12_4_ = fVar122 * fVar47;
            fVar128 = local_8b8._0_4_;
            auVar60._0_4_ = fVar128 * fVar71;
            fVar131 = local_8b8._4_4_;
            auVar60._4_4_ = fVar131 * fVar77;
            fVar132 = local_8b8._8_4_;
            auVar60._8_4_ = fVar132 * fVar79;
            fVar133 = local_8b8._12_4_;
            auVar60._12_4_ = fVar133 * fVar81;
            auVar85 = vsubps_avx(auVar60,auVar137);
            auVar35 = vsubps_avx(local_a28,auVar68);
            fVar135 = auVar35._0_4_;
            auVar75._0_4_ = fVar135 * fVar71;
            fVar139 = auVar35._4_4_;
            auVar75._4_4_ = fVar139 * fVar77;
            fVar141 = auVar35._8_4_;
            auVar75._8_4_ = fVar141 * fVar79;
            fVar143 = auVar35._12_4_;
            auVar75._12_4_ = fVar143 * fVar81;
            fVar71 = fVar11 + auVar68._0_4_;
            fVar77 = fVar13 + auVar68._4_4_;
            fVar79 = fVar58 + auVar68._8_4_;
            fVar81 = fVar15 + auVar68._12_4_;
            auVar103._0_4_ = fVar118 * fVar71;
            auVar103._4_4_ = fVar120 * fVar77;
            auVar103._8_4_ = fVar121 * fVar79;
            auVar103._12_4_ = fVar122 * fVar81;
            auVar35 = vsubps_avx(auVar103,auVar75);
            auVar94._0_4_ = fVar128 * fVar71;
            auVar94._4_4_ = fVar131 * fVar77;
            auVar94._8_4_ = fVar132 * fVar79;
            auVar94._12_4_ = fVar133 * fVar81;
            auVar28._0_4_ = fVar135 * fVar34;
            auVar28._4_4_ = fVar139 * fVar45;
            auVar28._8_4_ = fVar141 * fVar46;
            auVar28._12_4_ = fVar143 * fVar47;
            auVar36 = vsubps_avx(auVar28,auVar94);
            local_878._0_4_ =
                 fStack_a90 * auVar85._0_4_ +
                 local_ab8._4_4_ * auVar35._0_4_ + local_aa8._4_4_ * auVar36._0_4_;
            local_878._4_4_ =
                 fStack_a90 * auVar85._4_4_ +
                 local_ab8._4_4_ * auVar35._4_4_ + local_aa8._4_4_ * auVar36._4_4_;
            local_878._8_4_ =
                 fStack_a90 * auVar85._8_4_ +
                 local_ab8._4_4_ * auVar35._8_4_ + local_aa8._4_4_ * auVar36._8_4_;
            local_878._12_4_ =
                 fStack_a90 * auVar85._12_4_ +
                 local_ab8._4_4_ * auVar35._12_4_ + local_aa8._4_4_ * auVar36._12_4_;
            auVar85 = vsubps_avx(auVar68,auVar84);
            fVar106 = auVar84._0_4_ + auVar68._0_4_;
            fVar107 = auVar84._4_4_ + auVar68._4_4_;
            fVar108 = auVar84._8_4_ + auVar68._8_4_;
            fVar70 = auVar84._12_4_ + auVar68._12_4_;
            auVar68 = vsubps_avx(auVar83,auVar59);
            fVar77 = auVar83._0_4_ + auVar59._0_4_;
            fVar79 = auVar83._4_4_ + auVar59._4_4_;
            fVar81 = auVar83._8_4_ + auVar59._8_4_;
            fVar100 = auVar83._12_4_ + auVar59._12_4_;
            auVar83 = vsubps_avx(auVar26,auVar73);
            fVar45 = auVar26._0_4_ + auVar73._0_4_;
            fVar46 = auVar26._4_4_ + auVar73._4_4_;
            fVar47 = auVar26._8_4_ + auVar73._8_4_;
            fVar71 = auVar26._12_4_ + auVar73._12_4_;
            fVar72 = auVar83._0_4_;
            auVar86._0_4_ = fVar72 * fVar77;
            fVar78 = auVar83._4_4_;
            auVar86._4_4_ = fVar78 * fVar79;
            fVar80 = auVar83._8_4_;
            auVar86._8_4_ = fVar80 * fVar81;
            fVar82 = auVar83._12_4_;
            auVar86._12_4_ = fVar82 * fVar100;
            fVar123 = auVar68._0_4_;
            auVar95._0_4_ = fVar123 * fVar45;
            fVar125 = auVar68._4_4_;
            auVar95._4_4_ = fVar125 * fVar46;
            fVar126 = auVar68._8_4_;
            auVar95._8_4_ = fVar126 * fVar47;
            fVar127 = auVar68._12_4_;
            auVar95._12_4_ = fVar127 * fVar71;
            auVar68 = vsubps_avx(auVar95,auVar86);
            fVar34 = auVar85._0_4_;
            auVar38._0_4_ = fVar34 * fVar45;
            fVar45 = auVar85._4_4_;
            auVar38._4_4_ = fVar45 * fVar46;
            fVar46 = auVar85._8_4_;
            auVar38._8_4_ = fVar46 * fVar47;
            fVar47 = auVar85._12_4_;
            auVar38._12_4_ = fVar47 * fVar71;
            auVar96._0_4_ = fVar72 * fVar106;
            auVar96._4_4_ = fVar78 * fVar107;
            auVar96._8_4_ = fVar80 * fVar108;
            auVar96._12_4_ = fVar82 * fVar70;
            auVar83 = vsubps_avx(auVar96,auVar38);
            auVar61._0_4_ = fVar123 * fVar106;
            auVar61._4_4_ = fVar125 * fVar107;
            auVar61._8_4_ = fVar126 * fVar108;
            auVar61._12_4_ = fVar127 * fVar70;
            auVar51._0_4_ = fVar34 * fVar77;
            auVar51._4_4_ = fVar45 * fVar79;
            auVar51._8_4_ = fVar46 * fVar81;
            auVar51._12_4_ = fVar47 * fVar100;
            auVar26 = vsubps_avx(auVar51,auVar61);
            local_aa8._0_4_ = local_aa8._4_4_;
            fStack_aa0 = local_aa8._4_4_;
            fStack_a9c = local_aa8._4_4_;
            local_ab8._0_4_ = local_ab8._4_4_;
            fStack_ab0 = local_ab8._4_4_;
            fStack_aac = local_ab8._4_4_;
            auVar39._0_4_ =
                 fStack_a90 * auVar68._0_4_ +
                 local_ab8._4_4_ * auVar83._0_4_ + local_aa8._4_4_ * auVar26._0_4_;
            auVar39._4_4_ =
                 fStack_a90 * auVar68._4_4_ +
                 local_ab8._4_4_ * auVar83._4_4_ + local_aa8._4_4_ * auVar26._4_4_;
            auVar39._8_4_ =
                 fStack_a90 * auVar68._8_4_ +
                 local_ab8._4_4_ * auVar83._8_4_ + local_aa8._4_4_ * auVar26._8_4_;
            auVar39._12_4_ =
                 fStack_a90 * auVar68._12_4_ +
                 local_ab8._4_4_ * auVar83._12_4_ + local_aa8._4_4_ * auVar26._12_4_;
            local_868._0_4_ = auVar39._0_4_ + local_8c8._0_4_ + local_878._0_4_;
            local_868._4_4_ = auVar39._4_4_ + local_8c8._4_4_ + local_878._4_4_;
            local_868._8_4_ = auVar39._8_4_ + local_8c8._8_4_ + local_878._8_4_;
            local_868._12_4_ = auVar39._12_4_ + local_8c8._12_4_ + local_878._12_4_;
            auVar68 = vminps_avx(local_8c8,local_878);
            auVar68 = vminps_avx(auVar68,auVar39);
            auVar62._8_4_ = 0x7fffffff;
            auVar62._0_8_ = 0x7fffffff7fffffff;
            auVar62._12_4_ = 0x7fffffff;
            local_8d8 = vandps_avx(local_868,auVar62);
            auVar63._0_4_ = local_8d8._0_4_ * 1.1920929e-07;
            auVar63._4_4_ = local_8d8._4_4_ * 1.1920929e-07;
            auVar63._8_4_ = local_8d8._8_4_ * 1.1920929e-07;
            auVar63._12_4_ = local_8d8._12_4_ * 1.1920929e-07;
            uVar16 = CONCAT44(auVar63._4_4_,auVar63._0_4_);
            auVar87._0_8_ = uVar16 ^ 0x8000000080000000;
            auVar87._8_4_ = -auVar63._8_4_;
            auVar87._12_4_ = -auVar63._12_4_;
            auVar68 = vcmpps_avx(auVar68,auVar87,5);
            auVar83 = vmaxps_avx(local_8c8,local_878);
            auVar83 = vmaxps_avx(auVar83,auVar39);
            auVar83 = vcmpps_avx(auVar83,auVar63,2);
            local_8e8 = vorps_avx(auVar68,auVar83);
            local_abd = 0;
            auVar68 = local_9a8 & local_8e8;
            if ((((auVar68 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar68 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar68 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar68[0xf] < '\0') {
              auVar40._0_4_ = fVar128 * fVar48;
              auVar40._4_4_ = fVar131 * fVar56;
              auVar40._8_4_ = fVar132 * fVar32;
              auVar40._12_4_ = fVar133 * fVar33;
              auVar52._0_4_ = fVar144 * fVar118;
              auVar52._4_4_ = fVar145 * fVar120;
              auVar52._8_4_ = fVar146 * fVar121;
              auVar52._12_4_ = fVar147 * fVar122;
              auVar26 = vsubps_avx(auVar52,auVar40);
              auVar64._0_4_ = fVar118 * fVar123;
              auVar64._4_4_ = fVar120 * fVar125;
              auVar64._8_4_ = fVar121 * fVar126;
              auVar64._12_4_ = fVar122 * fVar127;
              auVar88._0_4_ = fVar128 * fVar72;
              auVar88._4_4_ = fVar131 * fVar78;
              auVar88._8_4_ = fVar132 * fVar80;
              auVar88._12_4_ = fVar133 * fVar82;
              auVar84 = vsubps_avx(auVar88,auVar64);
              auVar68 = vandps_avx(auVar62,auVar40);
              auVar83 = vandps_avx(auVar62,auVar64);
              auVar68 = vcmpps_avx(auVar68,auVar83,1);
              local_808 = vblendvps_avx(auVar84,auVar26,auVar68);
              auVar41._0_4_ = fVar135 * fVar72;
              auVar41._4_4_ = fVar139 * fVar78;
              auVar41._8_4_ = fVar141 * fVar80;
              auVar41._12_4_ = fVar143 * fVar82;
              auVar53._0_4_ = fVar135 * fVar48;
              auVar53._4_4_ = fVar139 * fVar56;
              auVar53._8_4_ = fVar141 * fVar32;
              auVar53._12_4_ = fVar143 * fVar33;
              auVar65._0_4_ = fVar118 * fVar134;
              auVar65._4_4_ = fVar120 * fVar138;
              auVar65._8_4_ = fVar121 * fVar140;
              auVar65._12_4_ = fVar122 * fVar142;
              auVar26 = vsubps_avx(auVar53,auVar65);
              auVar90._0_4_ = fVar118 * fVar34;
              auVar90._4_4_ = fVar120 * fVar45;
              auVar90._8_4_ = fVar121 * fVar46;
              auVar90._12_4_ = fVar122 * fVar47;
              auVar84 = vsubps_avx(auVar90,auVar41);
              auVar68 = vandps_avx(auVar62,auVar65);
              auVar83 = vandps_avx(auVar62,auVar41);
              auVar68 = vcmpps_avx(auVar68,auVar83,1);
              local_7f8 = vblendvps_avx(auVar84,auVar26,auVar68);
              auVar29._0_4_ = fVar128 * fVar34;
              auVar29._4_4_ = fVar131 * fVar45;
              auVar29._8_4_ = fVar132 * fVar46;
              auVar29._12_4_ = fVar133 * fVar47;
              auVar54._0_4_ = fVar128 * fVar134;
              auVar54._4_4_ = fVar131 * fVar138;
              auVar54._8_4_ = fVar132 * fVar140;
              auVar54._12_4_ = fVar133 * fVar142;
              auVar66._0_4_ = fVar144 * fVar135;
              auVar66._4_4_ = fVar145 * fVar139;
              auVar66._8_4_ = fVar146 * fVar141;
              auVar66._12_4_ = fVar147 * fVar143;
              auVar91._0_4_ = fVar135 * fVar123;
              auVar91._4_4_ = fVar139 * fVar125;
              auVar91._8_4_ = fVar141 * fVar126;
              auVar91._12_4_ = fVar143 * fVar127;
              auVar26 = vsubps_avx(auVar54,auVar66);
              auVar84 = vsubps_avx(auVar91,auVar29);
              auVar68 = vandps_avx(auVar62,auVar66);
              auVar83 = vandps_avx(auVar62,auVar29);
              auVar68 = vcmpps_avx(auVar68,auVar83,1);
              local_7e8 = vblendvps_avx(auVar84,auVar26,auVar68);
              fVar48 = local_808._0_4_ * fStack_a90 +
                       local_7f8._0_4_ * local_ab8._4_4_ + local_7e8._0_4_ * local_aa8._4_4_;
              fVar34 = local_808._4_4_ * fStack_a90 +
                       local_7f8._4_4_ * local_ab8._4_4_ + local_7e8._4_4_ * local_aa8._4_4_;
              fVar56 = local_808._8_4_ * fStack_a90 +
                       local_7f8._8_4_ * local_ab8._4_4_ + local_7e8._8_4_ * local_aa8._4_4_;
              fVar45 = local_808._12_4_ * fStack_a90 +
                       local_7f8._12_4_ * local_ab8._4_4_ + local_7e8._12_4_ * local_aa8._4_4_;
              auVar67._0_4_ = fVar48 + fVar48;
              auVar67._4_4_ = fVar34 + fVar34;
              auVar67._8_4_ = fVar56 + fVar56;
              auVar67._12_4_ = fVar45 + fVar45;
              fVar48 = local_808._0_4_ * fVar11 +
                       local_7f8._0_4_ * fVar2 + local_7e8._0_4_ * fVar113;
              fVar34 = local_808._4_4_ * fVar13 +
                       local_7f8._4_4_ * fVar12 + local_7e8._4_4_ * fVar115;
              fVar57 = local_808._8_4_ * fVar58 +
                       local_7f8._8_4_ * fVar57 + local_7e8._8_4_ * fVar116;
              fVar58 = local_808._12_4_ * fVar15 +
                       local_7f8._12_4_ * fVar14 + local_7e8._12_4_ * fVar117;
              auVar68 = vrcpps_avx(auVar67);
              fVar2 = auVar68._0_4_;
              auVar97._0_4_ = auVar67._0_4_ * fVar2;
              fVar11 = auVar68._4_4_;
              auVar97._4_4_ = auVar67._4_4_ * fVar11;
              fVar12 = auVar68._8_4_;
              auVar97._8_4_ = auVar67._8_4_ * fVar12;
              fVar13 = auVar68._12_4_;
              auVar97._12_4_ = auVar67._12_4_ * fVar13;
              auVar104._8_4_ = 0x3f800000;
              auVar104._0_8_ = 0x3f8000003f800000;
              auVar104._12_4_ = 0x3f800000;
              auVar68 = vsubps_avx(auVar104,auVar97);
              local_818._0_4_ = (fVar48 + fVar48) * (fVar2 + fVar2 * auVar68._0_4_);
              local_818._4_4_ = (fVar34 + fVar34) * (fVar11 + fVar11 * auVar68._4_4_);
              local_818._8_4_ = (fVar57 + fVar57) * (fVar12 + fVar12 * auVar68._8_4_);
              local_818._12_4_ = (fVar58 + fVar58) * (fVar13 + fVar13 * auVar68._12_4_);
              uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
              auVar92._4_4_ = uVar3;
              auVar92._0_4_ = uVar3;
              auVar92._8_4_ = uVar3;
              auVar92._12_4_ = uVar3;
              auVar68 = vcmpps_avx(auVar92,local_818,2);
              fVar2 = ray->tfar;
              auVar98._4_4_ = fVar2;
              auVar98._0_4_ = fVar2;
              auVar98._8_4_ = fVar2;
              auVar98._12_4_ = fVar2;
              auVar83 = vcmpps_avx(local_818,auVar98,2);
              auVar68 = vandps_avx(auVar68,auVar83);
              auVar83 = vcmpps_avx(auVar67,_DAT_01f7aa10,4);
              auVar68 = vandps_avx(auVar83,auVar68);
              auVar83 = vpand_avx(local_8e8,local_9a8);
              auVar68 = vpslld_avx(auVar68,0x1f);
              auVar68 = vpsrad_avx(auVar68,0x1f);
              local_848 = vpand_avx(auVar68,auVar83);
              uVar18 = vmovmskps_avx(local_848);
              if (uVar18 != 0) {
                local_888 = local_8c8;
                local_858 = &local_abd;
                auVar68 = vrcpps_avx(local_868);
                fVar2 = auVar68._0_4_;
                auVar42._0_4_ = local_868._0_4_ * fVar2;
                fVar11 = auVar68._4_4_;
                auVar42._4_4_ = local_868._4_4_ * fVar11;
                fVar12 = auVar68._8_4_;
                auVar42._8_4_ = local_868._8_4_ * fVar12;
                fVar13 = auVar68._12_4_;
                auVar42._12_4_ = local_868._12_4_ * fVar13;
                auVar55._8_4_ = 0x3f800000;
                auVar55._0_8_ = 0x3f8000003f800000;
                auVar55._12_4_ = 0x3f800000;
                auVar68 = vsubps_avx(auVar55,auVar42);
                auVar30._0_4_ = fVar2 + fVar2 * auVar68._0_4_;
                auVar30._4_4_ = fVar11 + fVar11 * auVar68._4_4_;
                auVar30._8_4_ = fVar12 + fVar12 * auVar68._8_4_;
                auVar30._12_4_ = fVar13 + fVar13 * auVar68._12_4_;
                auVar43._8_4_ = 0x219392ef;
                auVar43._0_8_ = 0x219392ef219392ef;
                auVar43._12_4_ = 0x219392ef;
                auVar68 = vcmpps_avx(local_8d8,auVar43,5);
                auVar68 = vandps_avx(auVar68,auVar30);
                auVar44._0_4_ = local_8c8._0_4_ * auVar68._0_4_;
                auVar44._4_4_ = local_8c8._4_4_ * auVar68._4_4_;
                auVar44._8_4_ = local_8c8._8_4_ * auVar68._8_4_;
                auVar44._12_4_ = local_8c8._12_4_ * auVar68._12_4_;
                local_838 = vminps_avx(auVar44,auVar55);
                auVar31._0_4_ = local_878._0_4_ * auVar68._0_4_;
                auVar31._4_4_ = local_878._4_4_ * auVar68._4_4_;
                auVar31._8_4_ = local_878._8_4_ * auVar68._8_4_;
                auVar31._12_4_ = local_878._12_4_ * auVar68._12_4_;
                local_828 = vminps_avx(auVar31,auVar55);
                uVar16 = (ulong)(uVar18 & 0xff);
                do {
                  uVar19 = 0;
                  if (uVar16 != 0) {
                    for (; (uVar16 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                    }
                  }
                  local_9f0 = *(uint *)((long)&local_898 + uVar19 * 4);
                  pGVar10 = (local_a80->geometries).items[local_9f0].ptr;
                  if ((pGVar10->mask & ray->mask) == 0) {
                    uVar16 = uVar16 ^ 1L << (uVar19 & 0x3f);
                  }
                  else {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar10->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_002c0244;
                    local_a98 = context->args;
                    local_a48._0_8_ = uVar16;
                    local_a38._0_8_ = uVar22;
                    local_a28._0_8_ = puVar21;
                    local_aa8 = context;
                    local_9d8.context = context->user;
                    local_a08 = *(undefined4 *)(local_808 + uVar19 * 4);
                    local_a04 = *(undefined4 *)(local_7f8 + uVar19 * 4);
                    local_a00 = *(undefined4 *)(local_7e8 + uVar19 * 4);
                    local_9fc = *(undefined4 *)(local_838 + uVar19 * 4);
                    local_9f8 = *(undefined4 *)(local_828 + uVar19 * 4);
                    local_9f4 = *(undefined4 *)((long)&local_8a8 + uVar19 * 4);
                    local_9ec = (local_9d8.context)->instID[0];
                    local_9e8 = (local_9d8.context)->instPrimID[0];
                    local_a68._0_4_ = ray->tfar;
                    local_a58._0_8_ = uVar19;
                    ray->tfar = *(float *)(local_818 + uVar19 * 4);
                    local_abc = -1;
                    local_9d8.valid = &local_abc;
                    local_9d8.geometryUserPtr = pGVar10->userPtr;
                    local_ab8 = ray;
                    local_9d8.hit = (RTCHitN *)&local_a08;
                    local_9d8.N = 1;
                    local_a78._0_8_ = pGVar10;
                    local_9d8.ray = (RTCRayN *)ray;
                    if ((pGVar10->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                       ((*pGVar10->occlusionFilterN)(&local_9d8), *local_9d8.valid != 0)) {
                      ray = local_ab8;
                      if ((local_a98->filter == (RTCFilterFunctionN)0x0) ||
                         (((local_a98->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                           RTC_RAY_QUERY_FLAG_INCOHERENT &&
                          ((*(byte *)(local_a78._0_8_ + 0x3e) & 0x40) == 0)))) {
LAB_002c0244:
                        ray->tfar = -INFINITY;
                        return;
                      }
                      (*local_a98->filter)(&local_9d8);
                      ray = local_ab8;
                      if (*local_9d8.valid != 0) goto LAB_002c0244;
                    }
                    local_ab8->tfar = (float)local_a68._0_4_;
                    uVar16 = local_a48._0_8_ ^ 1L << (local_a58._0_8_ & 0x3f);
                    ray = local_ab8;
                    context = local_aa8;
                    puVar21 = (ulong *)local_a28._0_8_;
                    uVar22 = local_a38._0_8_;
                  }
                } while (uVar16 != 0);
              }
            }
            local_a10 = local_a10 + 1;
            auVar99 = ZEXT1664(local_8f8);
            auVar105 = ZEXT1664(local_908);
            auVar112 = ZEXT1664(local_918);
            auVar114 = ZEXT1664(local_928);
            auVar119 = ZEXT1664(local_938);
            auVar76 = ZEXT1664(local_948);
            auVar124 = ZEXT1664(local_958);
            auVar89 = ZEXT1664(local_968);
            auVar69 = ZEXT1664(local_978);
            auVar93 = ZEXT1664(local_988);
            auVar130 = ZEXT1664(local_998);
          } while (local_a10 != local_a18);
        }
LAB_002c0234:
      } while (puVar21 != &local_7d8);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }